

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

bool __thiscall QMdi::ControllerWidget::event(ControllerWidget *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  ControllerWidget *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QHelpEvent *helpEvent;
  QStyleOptionComplex opt;
  QEvent *in_stack_000000c8;
  QWidget *in_stack_000000d0;
  SubControl in_stack_ffffffffffffff78;
  ComplexControl in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  ControllerWidget *this_00;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == ToolTip) {
    memset(local_50,0xaa,0x48);
    QStyleOptionComplex::QStyleOptionComplex
              ((QStyleOptionComplex *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    initStyleOption((ControllerWidget *)
                    CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                    (QStyleOptionComplex *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    this_00 = in_RSI;
    QHelpEvent::pos((QHelpEvent *)in_RSI);
    getSubControl(this_00,in_RDI);
    showToolTip((QHelpEvent *)in_RDI,&in_RSI->super_QWidget,
                (QStyleOptionComplex *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                ,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QStyleOptionComplex::~QStyleOptionComplex((QStyleOptionComplex *)0x62ba5b);
  }
  bVar1 = QWidget::event(in_stack_000000d0,in_stack_000000c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ControllerWidget::event(QEvent *event)
{
#if QT_CONFIG(tooltip)
    if (event->type() == QEvent::ToolTip) {
        QStyleOptionComplex opt;
        initStyleOption(&opt);
        QHelpEvent *helpEvent = static_cast<QHelpEvent *>(event);
        showToolTip(helpEvent, this, opt, QStyle::CC_MdiControls, getSubControl(helpEvent->pos()));
    }
#endif // QT_CONFIG(tooltip)
    return QWidget::event(event);
}